

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[85],kj::String&,char_const(&)[9],kj::StringPtr&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [85],String *params_1,
          char (*params_2) [9],StringPtr *params_3,char (*params_4) [3])

{
  char *pcVar1;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  AVar2 = toCharSequence<char_const(&)[85]>((char (*) [85])this);
  params_4_00 = (ArrayPtr<const_char> *)AVar2.ptr;
  pcVar1 = *(char **)(*params + 8);
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = *(char **)*params;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  local_48 = toCharSequence<char_const(&)[9]>((char (*) [9])params_1);
  local_58.ptr = *(char **)*params_2;
  local_58.size_ = *(long *)(*params_2 + 8) - 1;
  local_68 = toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&stack0xffffffffffffff88,&local_38,&local_48,&local_58,
             &local_68,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}